

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwutil.c
# Opt level: O1

void png_write_tEXt(png_structrp png_ptr,png_const_charp key,png_const_charp text,
                   png_size_t text_len)

{
  png_uint_32 pVar1;
  size_t length;
  char *error_message;
  png_byte new_key [80];
  png_byte apStack_78 [80];
  
  pVar1 = png_check_keyword(png_ptr,key,apStack_78);
  if (pVar1 == 0) {
    error_message = "tEXt: invalid keyword";
  }
  else {
    if ((text == (png_const_charp)0x0) || (*text == '\0')) {
      length = 0;
    }
    else {
      length = strlen(text);
    }
    if (length <= 0x7ffffffe - pVar1) {
      png_write_chunk_header(png_ptr,0x74455874,pVar1 + (int)length + 1);
      png_write_chunk_data(png_ptr,apStack_78,(ulong)(pVar1 + 1));
      if (length != 0) {
        png_write_chunk_data(png_ptr,(png_const_bytep)text,length);
      }
      png_write_chunk_end(png_ptr);
      return;
    }
    error_message = "tEXt: text too long";
  }
  png_error(png_ptr,error_message);
}

Assistant:

void /* PRIVATE */
png_write_tEXt(png_structrp png_ptr, png_const_charp key, png_const_charp text,
    png_size_t text_len)
{
   png_uint_32 key_len;
   png_byte new_key[80];

   png_debug(1, "in png_write_tEXt");

   key_len = png_check_keyword(png_ptr, key, new_key);

   if (key_len == 0)
      png_error(png_ptr, "tEXt: invalid keyword");

   if (text == NULL || *text == '\0')
      text_len = 0;

   else
      text_len = strlen(text);

   if (text_len > PNG_UINT_31_MAX - (key_len+1))
      png_error(png_ptr, "tEXt: text too long");

   /* Make sure we include the 0 after the key */
   png_write_chunk_header(png_ptr, png_tEXt,
       (png_uint_32)/*checked above*/(key_len + text_len + 1));
   /*
    * We leave it to the application to meet PNG-1.0 requirements on the
    * contents of the text.  PNG-1.0 through PNG-1.2 discourage the use of
    * any non-Latin-1 characters except for NEWLINE.  ISO PNG will forbid them.
    * The NUL character is forbidden by PNG-1.0 through PNG-1.2 and ISO PNG.
    */
   png_write_chunk_data(png_ptr, new_key, key_len + 1);

   if (text_len != 0)
      png_write_chunk_data(png_ptr, (png_const_bytep)text, text_len);

   png_write_chunk_end(png_ptr);
}